

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O0

bool P_Scroll3dMidtex(sector_t *sector,int crush,double move,bool ceiling)

{
  line_t *plVar1;
  bool bVar2;
  uint uVar3;
  line_t **pplVar4;
  sector_t **ppsVar5;
  bool bVar6;
  TArray<sector_t_*,_sector_t_*> *local_50;
  uint local_48;
  uint i_1;
  bool res;
  line_t *l;
  uint i;
  plane *scrollplane;
  bool ceiling_local;
  double move_local;
  int crush_local;
  sector_t *sector_local;
  
  if (ceiling) {
    local_50 = &(sector->e->Midtex).Ceiling.AttachedSectors;
  }
  else {
    local_50 = (TArray<sector_t_*,_sector_t_*> *)&sector->e->Midtex;
  }
  l._4_4_ = 0;
  while( true ) {
    uVar3 = TArray<line_t_*,_line_t_*>::Size((TArray<line_t_*,_line_t_*> *)(local_50 + 1));
    if (uVar3 <= l._4_4_) break;
    pplVar4 = TArray<line_t_*,_line_t_*>::operator[]
                        ((TArray<line_t_*,_line_t_*> *)(local_50 + 1),(ulong)l._4_4_);
    plVar1 = *pplVar4;
    side_t::AddTextureYOffset(plVar1->sidedef[0],1,move);
    side_t::AddTextureYOffset(plVar1->sidedef[1],1,move);
    l._4_4_ = l._4_4_ + 1;
  }
  bVar6 = false;
  local_48 = 0;
  while( true ) {
    uVar3 = TArray<sector_t_*,_sector_t_*>::Size(local_50);
    if (uVar3 <= local_48) break;
    ppsVar5 = TArray<sector_t_*,_sector_t_*>::operator[](local_50,(ulong)local_48);
    bVar2 = P_ChangeSector(*ppsVar5,crush,move,2,true);
    bVar6 = bVar6 != false || bVar2;
    local_48 = local_48 + 1;
  }
  return (bool)(bVar6 ^ 1);
}

Assistant:

bool P_Scroll3dMidtex(sector_t *sector, int crush, double move, bool ceiling)
{
	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// First step: Change all lines' texture offsets
	for(unsigned i = 0; i < scrollplane.AttachedLines.Size(); i++)
	{
		line_t *l = scrollplane.AttachedLines[i];

		l->sidedef[0]->AddTextureYOffset(side_t::mid, move);
		l->sidedef[1]->AddTextureYOffset(side_t::mid, move);
	}

	// Second step: Check all sectors whether the move is ok.
	bool res = false;

	for(unsigned i = 0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		res |= P_ChangeSector(scrollplane.AttachedSectors[i], crush, move, 2, true);
	}
	return !res;
}